

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

string * __thiscall
cmExportBuildFileGenerator::InstallNameDir
          (string *__return_storage_ptr__,cmExportBuildFileGenerator *this,cmGeneratorTarget *target
          ,string *config)

{
  bool bVar1;
  cmMakefile *this_00;
  allocator<char> local_49;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = cmTarget::GetMakefile(target->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_49);
  bVar1 = cmMakefile::IsOn(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_48,target,config);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportBuildFileGenerator::InstallNameDir(
  cmGeneratorTarget* target, const std::string& config)
{
  std::string install_name_dir;

  cmMakefile* mf = target->Target->GetMakefile();
  if (mf->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    install_name_dir = target->GetInstallNameDirForBuildTree(config);
  }

  return install_name_dir;
}